

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O0

uint8_t * icu_63::BytesTrie::jumpByDelta(uint8_t *pos)

{
  uint local_14;
  byte *pbStack_10;
  int32_t delta;
  uint8_t *pos_local;
  
  pbStack_10 = pos + 1;
  local_14 = (uint)*pos;
  if (0xbf < local_14) {
    if (local_14 < 0xf0) {
      local_14 = (local_14 - 0xc0) * 0x100 | (uint)*pbStack_10;
      pbStack_10 = pos + 2;
    }
    else if (local_14 < 0xfe) {
      local_14 = (local_14 - 0xf0) * 0x10000 | (uint)*pbStack_10 << 8 | (uint)pos[2];
      pbStack_10 = pos + 3;
    }
    else if (local_14 == 0xfe) {
      local_14 = (uint)*pbStack_10 << 0x10 | (uint)pos[2] << 8 | (uint)pos[3];
      pbStack_10 = pos + 4;
    }
    else {
      local_14 = (uint)*pbStack_10 << 0x18 | (uint)pos[2] << 0x10 | (uint)pos[3] << 8 | (uint)pos[4]
      ;
      pbStack_10 = pos + 5;
    }
  }
  return pbStack_10 + (int)local_14;
}

Assistant:

const uint8_t *
BytesTrie::jumpByDelta(const uint8_t *pos) {
    int32_t delta=*pos++;
    if(delta<kMinTwoByteDeltaLead) {
        // nothing to do
    } else if(delta<kMinThreeByteDeltaLead) {
        delta=((delta-kMinTwoByteDeltaLead)<<8)|*pos++;
    } else if(delta<kFourByteDeltaLead) {
        delta=((delta-kMinThreeByteDeltaLead)<<16)|(pos[0]<<8)|pos[1];
        pos+=2;
    } else if(delta==kFourByteDeltaLead) {
        delta=(pos[0]<<16)|(pos[1]<<8)|pos[2];
        pos+=3;
    } else {
        delta=(pos[0]<<24)|(pos[1]<<16)|(pos[2]<<8)|pos[3];
        pos+=4;
    }
    return pos+delta;
}